

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void read_compare(roaring_bitmap_t *r,uint32_t *ref_values,uint32_t ref_count,uint32_t step)

{
  roaring_uint32_iterator_t *it;
  uint in_ECX;
  uint in_EDX;
  uint *in_RSI;
  uint32_t i_1;
  uint32_t num_got;
  uint32_t i;
  uint32_t num_ask;
  uint32_t *buffer;
  roaring_uint32_iterator_t *iter;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint32_t in_stack_ffffffffffffffc0;
  uint uVar1;
  uint in_stack_ffffffffffffffc8;
  uint32_t in_stack_ffffffffffffffcc;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint local_14;
  uint *local_10;
  
  roaring_iterator_create
            ((roaring_bitmap_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  uVar1 = in_ECX;
  if (in_ECX == 0xffffffff) {
    uVar1 = 0x10000;
  }
  it = (roaring_uint32_iterator_t *)malloc((ulong)uVar1 << 2);
  local_10 = in_RSI;
  for (local_14 = in_EDX; local_14 != 0; local_14 = local_14 - in_stack_ffffffffffffffcc) {
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
    in_stack_ffffffffffffffd4 = in_ECX;
    if (in_ECX == 0xffffffff) {
      in_stack_ffffffffffffffd4 = 0;
      in_stack_ffffffffffffffd0 = 0;
      while ((in_stack_ffffffffffffffd0 < local_14 &&
             (local_10[in_stack_ffffffffffffffd0] >> 0x10 == *local_10 >> 0x10))) {
        in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1;
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1;
      }
    }
    in_stack_ffffffffffffffc0 =
         roaring_uint32_iterator_read
                   (it,(uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffcc);
    in_stack_ffffffffffffffcc = in_stack_ffffffffffffffc0;
    minimum_uint32(in_stack_ffffffffffffffd4,local_14);
    _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                 (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
    for (in_stack_ffffffffffffffc8 = 0; in_stack_ffffffffffffffc8 < in_stack_ffffffffffffffcc;
        in_stack_ffffffffffffffc8 = in_stack_ffffffffffffffc8 + 1) {
      _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
    }
    local_10 = local_10 + in_stack_ffffffffffffffcc;
  }
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  roaring_uint32_iterator_read
            (it,(uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  _assert_true(CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  free(it);
  roaring_uint32_iterator_free((roaring_uint32_iterator_t *)0x10a041);
  return;
}

Assistant:

void read_compare(roaring_bitmap_t *r, const uint32_t *ref_values,
                  uint32_t ref_count, uint32_t step) {
    roaring_uint32_iterator_t *iter = roaring_iterator_create(r);
    uint32_t *buffer = (uint32_t *)malloc(sizeof(uint32_t) *
                                          (step == UINT32_MAX ? 65536 : step));
    while (ref_count > 0) {
        assert_true(iter->has_value == true);
        assert_true(iter->current_value == ref_values[0]);

        uint32_t num_ask = step;
        if (step == UINT32_MAX) {
            num_ask = 0;
            for (uint32_t i = 0; i < ref_count; i++) {
                if ((ref_values[i] >> 16) == (ref_values[0] >> 16)) {
                    num_ask++;
                } else {
                    break;
                }
            }
        }

        uint32_t num_got = roaring_uint32_iterator_read(iter, buffer, num_ask);
        assert_true(num_got == minimum_uint32(num_ask, ref_count));
        for (uint32_t i = 0; i < num_got; i++) {
            assert_true(ref_values[i] == buffer[i]);
        }
        ref_values += num_got;
        ref_count -= num_got;
    }

    assert_true(iter->has_value == false);
    assert_true(iter->current_value == UINT32_MAX);

    assert_true(roaring_uint32_iterator_read(iter, buffer, step) == 0);
    assert_true(iter->has_value == false);
    assert_true(iter->current_value == UINT32_MAX);

    free(buffer);
    roaring_uint32_iterator_free(iter);
}